

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicstransform.cpp
# Opt level: O2

void __thiscall QGraphicsTransformPrivate::setItem(QGraphicsTransformPrivate *this,QGraphicsItem *i)

{
  undefined1 *puVar1;
  QGraphicsItem *this_00;
  QGraphicsItemPrivate *pQVar2;
  long in_FS_OFFSET;
  QGraphicsTransform *q;
  QGraphicsTransform *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->item;
  if (this_00 != i) {
    if (this_00 != (QGraphicsItem *)0x0) {
      local_30 = *(QGraphicsTransform **)&this->field_0x8;
      pQVar2 = (this_00->d_ptr).d;
      QGraphicsItem::prepareGeometryChange(this_00);
      QtPrivate::sequential_erase_with_copy<QList<QGraphicsTransform*>,QGraphicsTransform*>
                (&pQVar2->transformData->graphicsTransforms,&local_30);
      puVar1 = &pQVar2->field_0x166;
      *puVar1 = *puVar1 | 0x20;
    }
    this->item = i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsTransformPrivate::setItem(QGraphicsItem *i)
{
    if (item == i)
        return;

    if (item) {
        Q_Q(QGraphicsTransform);
        QGraphicsItemPrivate *d_ptr = item->d_ptr.data();

        item->prepareGeometryChange();
        Q_ASSERT(d_ptr->transformData);
        d_ptr->transformData->graphicsTransforms.removeAll(q);
        d_ptr->dirtySceneTransform = 1;
        item = nullptr;
    }

    item = i;
}